

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_work.hpp
# Opt level: O0

void __thiscall
asio::detail::handler_work<std::function<void(std::error_code_const&)>,asio::any_io_executor,void>::
complete<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>
          (handler_work<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor,_void>
           *this,binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *function,
          function<void_(const_std::error_code_&)> *handler)

{
  bool bVar1;
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void> *in_RDI;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *in_stack_ffffffffffffffd8
  ;
  
  bVar1 = handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
          owns_work((handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                     *)0x7000a2);
  if (bVar1) {
    handler_work_base<asio::any_io_executor,void,asio::io_context,asio::executor,void>::
    dispatch<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>,std::function<void(std::error_code_const&)>>
              (in_RDI,in_stack_ffffffffffffffd8,(function<void_(const_std::error_code_&)> *)0x7000c6
              );
  }
  else {
    binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::operator()
              ((binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)0x7000b0);
  }
  return;
}

Assistant:

void complete(Function& function, Handler& handler)
  {
    if (!base1_type::owns_work())
    {
      // When using a native implementation, I/O completion handlers are
      // already dispatched according to the execution context's executor's
      // rules. We can call the function directly.
      static_cast<Function&&>(function)();
    }
    else
    {
      base1_type::dispatch(function, handler);
    }
  }